

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O0

iterator __thiscall GCPtr<symbols::Object>::findPtrInfo(GCPtr<symbols::Object> *this,Object *ptr)

{
  bool bVar1;
  pointer pGVar2;
  _Self local_30;
  _List_node_base *local_28;
  Object *local_20;
  Object *ptr_local;
  GCPtr<symbols::Object> *this_local;
  iterator p;
  
  local_20 = ptr;
  ptr_local = (Object *)this;
  std::_List_iterator<GCInfo<symbols::Object>_>::_List_iterator
            ((_List_iterator<GCInfo<symbols::Object>_> *)&this_local);
  local_28 = (_List_node_base *)
             std::__cxx11::list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>
             ::begin(&gclist_abi_cxx11_);
  this_local = (GCPtr<symbols::Object> *)local_28;
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>::end
                   (&gclist_abi_cxx11_);
    bVar1 = std::operator==((_Self *)&this_local,&local_30);
    if ((((bVar1 ^ 0xffU) & 1) == 0) ||
       (pGVar2 = std::_List_iterator<GCInfo<symbols::Object>_>::operator->
                           ((_List_iterator<GCInfo<symbols::Object>_> *)&this_local),
       pGVar2->memPtr == local_20)) break;
    std::_List_iterator<GCInfo<symbols::Object>_>::operator++
              ((_List_iterator<GCInfo<symbols::Object>_> *)&this_local,0);
  }
  return (iterator)(_List_node_base *)this_local;
}

Assistant:

typename list<GCInfo<T>>::iterator GCPtr<T>::findPtrInfo(T *ptr){
    typename list<GCInfo<T>>::iterator p;

    // Find ptr in gclist.
    for(p = gclist.begin(); p != gclist.end(); p++){
        if(p->memPtr == ptr)
            return p;
    }
    return p;
}